

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O2

bool __thiscall
Js::EquivalentTypeCache::ClearUnusedTypes(EquivalentTypeCache *this,Recycler *recycler)

{
  Type *address;
  code *pcVar1;
  bool bVar2;
  bool bVar3;
  undefined4 *puVar4;
  JitPolyEquivalentTypeGuard *this_00;
  void *address_00;
  PropertyGuard *pPVar5;
  int __i;
  long lVar6;
  uint8 i;
  uint8 index;
  ushort uVar7;
  bool bVar8;
  
  pPVar5 = this->guard;
  if (pPVar5 == (PropertyGuard *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x229e,"(this->guard)","this->guard");
    if (!bVar2) goto LAB_006d8418;
    *puVar4 = 0;
    pPVar5 = this->guard;
  }
  if (((ulong)pPVar5->value & 0xfffffffffffffffd) == 0) {
LAB_006d8298:
    bVar8 = false;
  }
  else if (pPVar5->isPoly == true) {
    this_00 = PropertyGuard::AsPolyTypeCheckGuard(pPVar5);
    bVar8 = false;
    for (index = '\0'; index != '\b'; index = index + '\x01') {
      address_00 = (void *)JitPolyEquivalentTypeGuard::GetPolyValue(this_00,index);
      bVar2 = bVar8;
      if ((long)address_00 - 3U < 0xfffffffffffffffe) {
        bVar3 = Memory::HeapBlockMap64::IsMarked(&recycler->heapBlockMap,address_00);
        bVar2 = true;
        if (!bVar3) {
          JitPolyEquivalentTypeGuard::InvalidateDuringSweep(this_00,index);
          bVar2 = bVar8;
        }
      }
      bVar8 = bVar2;
    }
  }
  else {
    bVar2 = Memory::HeapBlockMap64::IsMarked(&recycler->heapBlockMap,(void *)pPVar5->value);
    bVar8 = true;
    if (!bVar2) {
      PropertyGuard::InvalidateDuringSweep(this->guard);
      goto LAB_006d8298;
    }
  }
  puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  uVar7 = 0;
  bVar2 = false;
  for (lVar6 = 0; lVar6 != 8; lVar6 = lVar6 + 1) {
    address = this->types[lVar6];
    if (address == (Type *)0x0) goto LAB_006d832f;
    this->types[lVar6] = (Type *)0x0;
    bVar3 = Memory::HeapBlockMap64::IsMarked(&recycler->heapBlockMap,address);
    if (bVar3) {
      this->types[uVar7] = address;
      if (this->guard->isPoly == false) {
        bVar2 = (bool)(bVar2 | (Type *)this->guard->value == address);
        uVar7 = uVar7 + 1;
      }
      else {
        bVar2 = true;
        uVar7 = uVar7 + 1;
      }
    }
  }
LAB_006d837d:
  bVar3 = true;
  if (uVar7 == 0) {
    pPVar5 = this->guard;
    bVar3 = bVar8;
    if (pPVar5->isPoly == true) {
      if (!bVar8) {
LAB_006d83a6:
        PropertyGuard::Invalidate(pPVar5);
      }
    }
    else if (pPVar5->value == 2) goto LAB_006d83a6;
  }
  if (((this->guard->value & 0xfffffffffffffffdU) != 0) && (uVar7 != 0 && !bVar2)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x22fb,
                                "(!this->guard->IsValid() || isGuardValuePresent || nonNullIndex == 0)"
                                ,
                                "After ClearUnusedTypes, valid guard value should be one of the cached equivalent types."
                               );
    if (!bVar2) {
LAB_006d8418:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  return bVar3;
LAB_006d832f:
  if (lVar6 == 8) goto LAB_006d837d;
  if (this->types[lVar6] != (Type *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x22e1,"(this->types[__i] == nullptr)",
                                "this->types[__i] == nullptr");
    if (!bVar3) goto LAB_006d8418;
    *puVar4 = 0;
  }
  lVar6 = lVar6 + 1;
  goto LAB_006d832f;
}

Assistant:

bool EquivalentTypeCache::ClearUnusedTypes(Recycler *recycler)
    {
        bool isAnyTypeLive = false;

        Assert(this->guard);
        if (this->guard->IsValid())
        {
            if (this->guard->IsPoly())
            {
                JitPolyEquivalentTypeGuard * polyGuard = this->guard->AsPolyTypeCheckGuard();
                for (uint8 i = 0; i < polyGuard->GetSize(); i++)
                {
                    intptr_t value = polyGuard->GetPolyValue(i);
                    if (value != PropertyGuard::GuardValue::Uninitialized && value != PropertyGuard::GuardValue::Invalidated_DuringSweep)
                    {
                        Type *type = reinterpret_cast<Type*>(value);
                        if (!recycler->IsObjectMarked(type))
                        {
                            polyGuard->InvalidateDuringSweep(i);
                        }
                        else
                        {
                            isAnyTypeLive = true;
                        }
                    }
                }
            }
            else
            {
                Type *type = reinterpret_cast<Type*>(this->guard->GetValue());
                if (!recycler->IsObjectMarked(type))
                {
                    this->guard->InvalidateDuringSweep();
                }
                else
                {
                    isAnyTypeLive = true;
                }
            }
        }
        uint16 nonNullIndex = 0;
#if DBG
        bool isGuardValuePresent = false;
#endif
        for (int i = 0; i < EQUIVALENT_TYPE_CACHE_SIZE; i++)
        {
            Type *type = this->types[i];
            if (type != nullptr)
            {
                this->types[i] = nullptr;
                if (recycler->IsObjectMarked(type))
                {
                    // compact the types array by moving non-null types
                    // to the beginning.
                    this->types[nonNullIndex++] = type;
#if DBG
                    if (guard->IsPoly())
                    {
                        isGuardValuePresent = true;
                    }
                    else if (this->guard->GetValue() == reinterpret_cast<intptr_t>(type))
                    {
                        isGuardValuePresent = true;
                    }
#endif
                }
            }
            else
            {
#ifdef DEBUG
                for (int __i = i; __i < EQUIVALENT_TYPE_CACHE_SIZE; __i++)
                { Assert(this->types[__i] == nullptr); }
#endif
                break; // array must be shrinked already
            }
        }

        if (nonNullIndex > 0)
        {
            isAnyTypeLive = true;
        }
        else if (guard->IsPoly())
        {
            if (!isAnyTypeLive)
            {
                guard->Invalidate();
            }
        }
        else if (guard->IsInvalidatedDuringSweep())
        {
            // just mark this as actual invalidated since there are no types
            // present
            guard->Invalidate();
        }

        // verify if guard value is valid, it is present in one of the types
        AssertMsg(!this->guard->IsValid() || isGuardValuePresent || nonNullIndex == 0,
            "After ClearUnusedTypes, valid guard value should be one of the cached equivalent types.");
        return isAnyTypeLive;
    }